

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_dc_left_predictor_4x4_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined8 uVar6;
  undefined1 auVar7 [16];
  
  uVar2 = *(ulong *)left;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar2;
  auVar3._12_2_ = (short)(uVar2 >> 0x30);
  auVar4._8_2_ = (short)(uVar2 >> 0x20);
  auVar4._0_8_ = uVar2;
  auVar4._10_4_ = auVar3._10_4_;
  auVar5._6_8_ = 0;
  auVar5._0_6_ = auVar4._8_6_;
  auVar7 = ZEXT416((auVar3._10_4_ >> 0x10) +
                   (int)CONCAT82(SUB148(auVar5 << 0x40,6),(short)(uVar2 >> 0x10)) +
                   auVar4._8_4_ + (uint)(ushort)uVar2 + 2 >> 2);
  auVar7 = pshuflw(auVar7,auVar7,0);
  uVar6 = auVar7._0_8_;
  *(undefined8 *)dst = uVar6;
  puVar1 = dst + stride;
  *(undefined8 *)puVar1 = uVar6;
  *(undefined8 *)(puVar1 + stride) = uVar6;
  *(undefined8 *)(puVar1 + stride + stride) = uVar6;
  return;
}

Assistant:

static inline void highbd_dc_left_predictor(uint16_t *dst, ptrdiff_t stride,
                                            int bw, int bh,
                                            const uint16_t *above,
                                            const uint16_t *left, int bd) {
  int i, r, expected_dc, sum = 0;
  (void)above;
  (void)bd;

  for (i = 0; i < bh; i++) sum += left[i];
  expected_dc = (sum + (bh >> 1)) / bh;

  for (r = 0; r < bh; r++) {
    aom_memset16(dst, expected_dc, bw);
    dst += stride;
  }
}